

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::BitfieldInsertCase::compare
          (BitfieldInsertCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  pointer pSVar2;
  long lVar3;
  int iVar4;
  ostream *stream;
  byte bVar5;
  ostringstream *this_00;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  Hex<8UL> local_30;
  
  pSVar2 = (this->super_IntegerFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar2->varType).m_data.basic.precision;
  iVar4 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  bVar6 = iVar4 < 1;
  if (0 < iVar4) {
    uVar7 = (2 << ((&DAT_01c96080)[(ulong)PVar1 * 4] - 1 & 0x1f)) - 1;
    uVar8 = ~(-1 << ((byte)*inputs[3] & 0x1f));
    if (*inputs[3] == 0x20) {
      uVar8 = 0xffffffff;
    }
    bVar5 = (byte)*inputs[2];
    uVar9 = ~(uVar8 << (bVar5 & 0x1f));
    uVar11 = (*inputs[1] & uVar8) << (bVar5 & 0x1f) | **inputs & uVar9;
    lVar10 = 0;
    if (((**outputs ^ uVar11) & uVar7) == 0) {
      lVar10 = 0;
      do {
        if (iVar4 + -1 == (int)lVar10) {
          return true;
        }
        uVar11 = (*(uint *)((long)inputs[1] + (lVar10 + 1) * 4) & uVar8) << (bVar5 & 0x1f) |
                 *(uint *)((long)*inputs + (lVar10 + 1) * 4) & uVar9;
        lVar3 = lVar10 + 1;
        lVar10 = lVar10 + 1;
      } while (((*(uint *)((long)*outputs + lVar3 * 4) ^ uVar11) & uVar7) == 0);
      bVar6 = iVar4 <= (int)lVar10;
    }
    this_00 = &(this->super_IntegerFunctionCase).m_failMsg;
    std::__ostream_insert<char,std::char_traits<char>>
              (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
    stream = (ostream *)std::ostream::operator<<(this_00,(int)lVar10);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"] = ",4);
    local_30.value = (deUint64)uVar11;
    tcu::Format::Hex<8UL>::toStream(&local_30,stream);
  }
  return bVar6;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			cmpMask			= getLowBitMask(integerLength);
		const int				offset			= *((const int*)inputs[2]);
		const int				bits			= *((const int*)inputs[3]);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	base	= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	insert	= ((const deUint32*)inputs[1])[compNdx];
			const deInt32	out		= ((const deUint32*)outputs[0])[compNdx];

			const deUint32	mask	= bits == 32 ? ~0u : (1u<<bits)-1;
			const deUint32	ref		= (base & ~(mask<<offset)) | ((insert & mask)<<offset);

			if ((out&cmpMask) != (ref&cmpMask))
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref);
				return false;
			}
		}

		return true;
	}